

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

Result_t * Kumu::Result_t::Delete(Result_t *__return_storage_ptr__,int v)

{
  Result_t *pRVar1;
  undefined4 uVar2;
  Mutex *__mutex;
  ILogSink *this;
  map_entry_t *pmVar3;
  ulong uVar4;
  
  __mutex = s_MapLock;
  if (v - 100U < 0xffffff39) {
    this = DefaultLogSink();
    ILogSink::Error(this,"Cannot delete core result code: %ld\n",(ulong)(uint)v);
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FAIL);
  }
  else {
    if (s_MapLock == (Mutex *)0x0) {
      __assert_fail("s_MapLock",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                    ,99,"static Kumu::Result_t Kumu::Result_t::Delete(int)");
    }
    pthread_mutex_lock((pthread_mutex_t *)s_MapLock);
    if ((ulong)s_MapSize != 0) {
      pmVar3 = s_ResultMap;
      uVar4 = 0;
LAB_00117485:
      pmVar3 = pmVar3 + 1;
      if (pmVar3[-1].rcode != v) goto code_r0x0011748b;
      if ((int)uVar4 + 1U < s_MapSize) {
        do {
          uVar2 = *(undefined4 *)&pmVar3->field_0x4;
          pRVar1 = pmVar3->result;
          s_ResultMap[uVar4 & 0xffffffff].rcode = pmVar3->rcode;
          *(undefined4 *)&s_ResultMap[uVar4 & 0xffffffff].field_0x4 = uVar2;
          s_ResultMap[uVar4 & 0xffffffff].result = pRVar1;
          uVar4 = uVar4 + 1;
          pmVar3 = pmVar3 + 1;
        } while (s_MapSize - 1 != (int)uVar4);
      }
      s_MapSize = s_MapSize - 1;
      Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
      goto LAB_001174ea;
    }
LAB_00117497:
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FALSE);
LAB_001174ea:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
code_r0x0011748b:
  uVar4 = uVar4 + 1;
  if (s_MapSize == uVar4) goto LAB_00117497;
  goto LAB_00117485;
}

Assistant:

Kumu::Result_t
Kumu::Result_t::Delete(int v)
{
  if ( v < -99 || v > 99 )
    {
      DefaultLogSink().Error("Cannot delete core result code: %ld\n", v);
      return RESULT_FAIL;
    }

  assert(s_MapLock);
  AutoMutex L(*s_MapLock);

  for ( ui32_t i = 0; i < s_MapSize; ++i )
    {
      if ( s_ResultMap[i].rcode == v )
	{
	  for ( ++i; i < s_MapSize; ++i )
	    s_ResultMap[i-1] = s_ResultMap[i];

	  --s_MapSize;
	  return RESULT_OK;
	}
    }

  return RESULT_FALSE;
}